

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

void __thiscall miniros::NodeHandle::construct(NodeHandle *this,string *ns,bool validate_name)

{
  bool bVar1;
  NodeHandleBackingCollection *this_00;
  allocator<char> local_61;
  undefined1 local_60 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  string local_40;
  
  bVar1 = isInitialized();
  if (!bVar1) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (construct::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"miniros.unknown_package",&local_61);
      console::initializeLogLocation(&construct::loc,&local_40,Fatal);
      std::__cxx11::string::~string((string *)&local_40);
    }
    if (construct::loc.level_ != Fatal) {
      console::setLogLocationLevel(&construct::loc,Fatal);
      console::checkLogLocationEnabled(&construct::loc);
    }
    if (construct::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,construct::loc.logger_,construct::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/node_handle.cpp"
                     ,0xa0,"void miniros::NodeHandle::construct(const std::string &, bool)",
                     "You must call miniros::init() before creating the first NodeHandle");
    }
  }
  this_00 = (NodeHandleBackingCollection *)operator_new(0xa8);
  getTopicManager((NodeHandle *)local_60);
  getServiceManager((NodeHandle *)(local_60 + 0x10));
  NodeHandleBackingCollection::NodeHandleBackingCollection
            (this_00,(TopicManagerPtr *)local_60,(ServiceManagerPtr *)(local_60 + 0x10));
  this->collection_ = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  std::__cxx11::string::_M_assign((string *)&this->unresolved_namespace_);
  if (validate_name) {
    resolveName(&local_40,this,ns,true);
  }
  else {
    resolveName();
  }
  std::__cxx11::string::operator=((string *)this,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this->ok_ = true;
  std::mutex::lock((mutex *)g_nh_refcount_mutex);
  if (g_nh_refcount == 0) {
    bVar1 = isStarted();
    if (!bVar1) {
      g_node_started_by_nh = 1;
      miniros::start();
    }
  }
  g_nh_refcount = g_nh_refcount + 1;
  pthread_mutex_unlock((pthread_mutex_t *)g_nh_refcount_mutex);
  return;
}

Assistant:

void NodeHandle::construct(const std::string& ns, bool validate_name)
{
  if (!miniros::isInitialized())
  {
    MINIROS_FATAL("You must call miniros::init() before creating the first NodeHandle");
    MINIROS_BREAK();
  }

  collection_ = new NodeHandleBackingCollection(getTopicManager(), getServiceManager());
  unresolved_namespace_ = ns;
  // if callback_queue_ is nonnull, we are in a non-nullary constructor

  if (validate_name)
    namespace_ = resolveName(ns, true);
  else
    {
      namespace_ = resolveName(ns, true, no_validate());
      // FIXME validate namespace_ now
    }
  ok_ = true;

  std::scoped_lock<std::mutex> lock(g_nh_refcount_mutex);

  if (g_nh_refcount == 0 && !miniros::isStarted())
  {
    g_node_started_by_nh = true;
    miniros::start();
  }

  ++g_nh_refcount;
}